

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O1

int __thiscall
glslang::TPpContext::eval
          (TPpContext *this,int token,int precedence,bool shortCircuit,int *res,bool *err,
          TPpToken *ppToken)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  code *pcVar3;
  pointer pptVar4;
  TParseContextBase *pTVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  _Base_ptr p_Var12;
  EShMessages EVar13;
  bool bVar14;
  TSourceLoc loc;
  undefined4 local_48;
  undefined4 uStack_44;
  int iStack_40;
  int iStack_3c;
  undefined8 local_38;
  
  while( true ) {
    local_38 = *(undefined8 *)&(ppToken->loc).column;
    local_48 = *(undefined4 *)&(ppToken->loc).name;
    uStack_44 = *(undefined4 *)((long)&(ppToken->loc).name + 4);
    iStack_40 = (ppToken->loc).string;
    iStack_3c = (ppToken->loc).line;
    if (token < 0x98) break;
    if (token == 0x98) {
      *res = (ppToken->field_3).ival;
      goto LAB_004cef55;
    }
    if (token != 0xa2) goto LAB_004ceed1;
    iVar6 = strcmp("defined",ppToken->name);
    if (iVar6 == 0) {
      if (((((this->parseContext->super_TParseVersions).messages & EShMsgReadHlsl) == EShMsgDefault)
          && (pptVar4 = (this->inputStack).
                        super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
             pptVar4 !=
             (this->inputStack).
             super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
             ._M_impl.super__Vector_impl_data._M_start)) &&
         (iVar6 = (*pptVar4[-1]->_vptr_tInput[8])(), (char)iVar6 != '\0')) {
        pTVar5 = this->parseContext;
        EVar13 = (pTVar5->super_TParseVersions).messages & EShMsgRelaxedErrors;
        pcVar9 = "nonportable when expanded from macros for preprocessor expression";
        if (EVar13 == EShMsgDefault) {
          pcVar9 = "cannot use in preprocessor expression when expanded from macros";
        }
        (*(pTVar5->super_TParseVersions)._vptr_TParseVersions[(ulong)EVar13 + 0x2f])
                  (pTVar5,ppToken,pcVar9,"defined","");
      }
      iVar8 = scanToken(this,ppToken);
      token = iVar8;
      if (iVar8 == 0x28) {
        token = scanToken(this,ppToken);
      }
      if (token == 0xa2) {
        iVar6 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
        p_Var1 = &(this->macroDefs).
                  super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
                  ._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = (this->macroDefs).
                  super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &p_Var1->_M_header;
        for (; p_Var12 != (_Base_ptr)0x0;
            p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < iVar6]) {
          if (iVar6 <= (int)p_Var12[1]._M_color) {
            p_Var10 = p_Var12;
          }
        }
        p_Var12 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
           (p_Var12 = p_Var10, iVar6 < (int)p_Var10[1]._M_color)) {
          p_Var12 = &p_Var1->_M_header;
        }
        uVar7 = 0;
        if ((_Rb_tree_header *)p_Var12 != p_Var1) {
          uVar7 = (uint)(((ulong)p_Var12[3]._M_left & 4) == 0);
        }
        *res = uVar7;
        token = scanToken(this,ppToken);
        bVar14 = true;
        iVar6 = token;
        if (iVar8 == 0x28) {
          if (token == 0x29) {
            iVar6 = scanToken(this,ppToken);
            bVar14 = true;
          }
          else {
            bVar14 = false;
            (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                      (this->parseContext,&local_48,"expected \')\'","preprocessor evaluation","");
            *err = true;
            *res = 0;
          }
        }
      }
      else {
        bVar14 = false;
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,&local_48,"incorrect directive, expected identifier",
                   "preprocessor evaluation","");
        *err = true;
        *res = 0;
        iVar6 = token;
      }
      goto LAB_004cefa9;
    }
    iVar6 = tokenPaste(this,0xa2,ppToken);
    token = evalToToken(this,iVar6,shortCircuit,res,err,ppToken);
  }
  if (token == 0x21) {
    uVar11 = 3;
    bVar14 = true;
  }
  else {
    if (token == 0x28) {
      iVar6 = scanToken(this,ppToken);
      iVar6 = eval(this,iVar6,0,shortCircuit,res,err,ppToken);
      if (*err == false) {
        if (iVar6 != 0x29) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,&local_48,"expected \')\'","preprocessor evaluation","");
          *err = true;
          *res = 0;
          return iVar6;
        }
LAB_004cef55:
        iVar6 = scanToken(this,ppToken);
      }
      goto LAB_004cefb4;
    }
LAB_004ceed1:
    uVar7 = 2;
    do {
      bVar14 = uVar7 != 0xffffffff;
      if (uVar7 == 0xffffffff) {
        iVar8 = 0;
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,&local_48,"bad expression","preprocessor evaluation","");
        *err = true;
        iVar6 = token;
        goto LAB_004cefa3;
      }
      uVar11 = (ulong)uVar7;
      uVar7 = uVar7 - 1;
    } while (*(int *)((anonymous_namespace)::unop + uVar11 * 0x10) != token);
  }
  iVar6 = scanToken(this,ppToken);
  iVar6 = eval(this,iVar6,0xc,shortCircuit,res,err,ppToken);
  iVar8 = (**(code **)((anonymous_namespace)::unop + uVar11 * 0x10 + 8))(*res);
LAB_004cefa3:
  *res = iVar8;
LAB_004cefa9:
  if (!bVar14) {
    return token;
  }
LAB_004cefb4:
  iVar6 = evalToToken(this,iVar6,shortCircuit,res,err,ppToken);
  do {
    if (*err != false) {
      return iVar6;
    }
    if (iVar6 == 10) {
      return 10;
    }
    if (iVar6 == 0x29) {
      return 0x29;
    }
    uVar7 = 0x11;
    do {
      if (*(int *)((anonymous_namespace)::binop + (ulong)uVar7 * 0x10) == iVar6) goto LAB_004cf011;
      bVar14 = uVar7 != 0;
      uVar7 = uVar7 - 1;
    } while (bVar14);
    uVar7 = 0xffffffff;
LAB_004cf011:
    if ((int)uVar7 < 0) {
      bVar14 = false;
    }
    else {
      iVar8 = *(int *)((anonymous_namespace)::binop + (ulong)uVar7 * 0x10 + 4);
      if (precedence < iVar8) {
        iVar2 = *res;
        if (((shortCircuit & 1U) == 0) &&
           ((iVar2 == 1 && iVar6 == 0x8e || (iVar6 == 0x8d && iVar2 == 0)))) {
          shortCircuit = true;
        }
        iVar6 = scanToken(this,ppToken);
        iVar6 = eval(this,iVar6,iVar8,(bool)(shortCircuit & 1),res,err,ppToken);
        pcVar3 = *(code **)((anonymous_namespace)::binop + (ulong)uVar7 * 0x10 + 8);
        if ((pcVar3 == anon_unknown_6::op_div || pcVar3 == anon_unknown_6::op_mod) && (*res == 0)) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,&local_48,"division by 0","preprocessor evaluation","");
          *res = 1;
        }
        iVar8 = (*pcVar3)(iVar2,*res);
        *res = iVar8;
        bVar14 = true;
      }
      else {
        bVar14 = false;
      }
    }
    if (!bVar14) {
      return iVar6;
    }
  } while( true );
}

Assistant:

int TPpContext::eval(int token, int precedence, bool shortCircuit, int& res, bool& err, TPpToken* ppToken)
{
    TSourceLoc loc = ppToken->loc;  // because we sometimes read the newline before reporting the error
    if (token == PpAtomIdentifier) {
        if (strcmp("defined", ppToken->name) == 0) {
            if (! parseContext.isReadingHLSL() && isMacroInput()) {
                if (parseContext.relaxedErrors())
                    parseContext.ppWarn(ppToken->loc, "nonportable when expanded from macros for preprocessor expression",
                        "defined", "");
                else
                    parseContext.ppError(ppToken->loc, "cannot use in preprocessor expression when expanded from macros",
                        "defined", "");
            }
            bool needclose = 0;
            token = scanToken(ppToken);
            if (token == '(') {
                needclose = true;
                token = scanToken(ppToken);
            }
            if (token != PpAtomIdentifier) {
                parseContext.ppError(loc, "incorrect directive, expected identifier", "preprocessor evaluation", "");
                err = true;
                res = 0;

                return token;
            }

            MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
            res = macro != nullptr ? !macro->undef : 0;
            token = scanToken(ppToken);
            if (needclose) {
                if (token != ')') {
                    parseContext.ppError(loc, "expected ')'", "preprocessor evaluation", "");
                    err = true;
                    res = 0;

                    return token;
                }
                token = scanToken(ppToken);
            }
        } else {
            token = tokenPaste(token, *ppToken);
            token = evalToToken(token, shortCircuit, res, err, ppToken);
            return eval(token, precedence, shortCircuit, res, err, ppToken);
        }
    } else if (token == PpAtomConstInt) {
        res = ppToken->ival;
        token = scanToken(ppToken);
    } else if (token == '(') {
        token = scanToken(ppToken);
        token = eval(token, MIN_PRECEDENCE, shortCircuit, res, err, ppToken);
        if (! err) {
            if (token != ')') {
                parseContext.ppError(loc, "expected ')'", "preprocessor evaluation", "");
                err = true;
                res = 0;

                return token;
            }
            token = scanToken(ppToken);
        }
    } else {
        int op = NUM_ELEMENTS(unop) - 1;
        for (; op >= 0; op--) {
            if (unop[op].token == token)
                break;
        }
        if (op >= 0) {
            token = scanToken(ppToken);
            token = eval(token, UNARY, shortCircuit, res, err, ppToken);
            res = unop[op].op(res);
        } else {
            parseContext.ppError(loc, "bad expression", "preprocessor evaluation", "");
            err = true;
            res = 0;

            return token;
        }
    }

    token = evalToToken(token, shortCircuit, res, err, ppToken);

    // Perform evaluation of binary operation, if there is one, otherwise we are done.
    while (! err) {
        if (token == ')' || token == '\n')
            break;
        int op;
        for (op = NUM_ELEMENTS(binop) - 1; op >= 0; op--) {
            if (binop[op].token == token)
                break;
        }
        if (op < 0 || binop[op].precedence <= precedence)
            break;
        int leftSide = res;

        // Setup short-circuiting, needed for ES, unless already in a short circuit.
        // (Once in a short-circuit, can't turn off again, until that whole subexpression is done.
        if (! shortCircuit) {
            if ((token == PpAtomOr  && leftSide == 1) ||
                (token == PpAtomAnd && leftSide == 0))
                shortCircuit = true;
        }

        token = scanToken(ppToken);
        token = eval(token, binop[op].precedence, shortCircuit, res, err, ppToken);

        if (binop[op].op == op_div || binop[op].op == op_mod) {
            if (res == 0) {
                parseContext.ppError(loc, "division by 0", "preprocessor evaluation", "");
                res = 1;
            }
        }
        res = binop[op].op(leftSide, res);
    }

    return token;
}